

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O0

Instance * get_headless_instance(Instance *__return_storage_ptr__,uint32_t minor_version)

{
  bool value;
  InstanceBuilder *pIVar1;
  Instance *__src;
  Decomposer local_1c2;
  ExprLhs<bool> local_1c1;
  StringRef local_1c0;
  SourceLineInfo local_1b0;
  StringRef local_1a0;
  undefined1 local_190 [8];
  AssertionHandler catchAssertionHandler;
  InstanceBuilder local_138;
  undefined1 local_50 [8];
  Result<vkb::Instance> instance_ret;
  uint32_t minor_version_local;
  
  instance_ret._60_4_ = minor_version;
  vkb::InstanceBuilder::InstanceBuilder(&local_138);
  pIVar1 = vkb::InstanceBuilder::request_validation_layers(&local_138,true);
  pIVar1 = vkb::InstanceBuilder::require_api_version(pIVar1,1,instance_ret._60_4_,0);
  pIVar1 = vkb::InstanceBuilder::set_headless(pIVar1,true);
  vkb::InstanceBuilder::build((Result<vkb::Instance> *)local_50,pIVar1);
  vkb::InstanceBuilder::~InstanceBuilder(&local_138);
  local_1a0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/tests/vulkan_mock_setup.cpp"
             ,0xc);
  local_1c0 = operator____catch_sr("instance_ret.has_value()",0x18);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_190,local_1a0,&local_1b0,local_1c0,Normal);
  value = vkb::Result<vkb::Instance>::has_value((Result<vkb::Instance> *)local_50);
  local_1c1 = Catch::operator<=<bool,_0>(&local_1c2,value);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_190,&local_1c1);
  Catch::AssertionHandler::complete((AssertionHandler *)local_190);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_190);
  __src = vkb::Result<vkb::Instance>::value((Result<vkb::Instance> *)local_50);
  memcpy(__return_storage_ptr__,__src,0x38);
  vkb::Result<vkb::Instance>::~Result((Result<vkb::Instance> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

vkb::Instance get_headless_instance(uint32_t minor_version) {
    auto instance_ret =
        vkb::InstanceBuilder().request_validation_layers().require_api_version(1, minor_version).set_headless().build();
    REQUIRE(instance_ret.has_value());
    return instance_ret.value();
}